

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpeechBubble.h
# Opt level: O1

SpeechBubble * __thiscall SpeechBubble::operator=(SpeechBubble *this,SpeechBubble *param_1)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  std::__cxx11::string::operator=((string *)this,(string *)param_1);
  peVar1 = (param_1->sprite).super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (param_1->sprite).super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (param_1->sprite).super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (param_1->sprite).super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->sprite).super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->sprite).super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->sprite).super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  memcpy(&(this->soundSample).super_AudioSource.mFlags,
         &(param_1->soundSample).super_AudioSource.mFlags,0x90);
  (this->soundSample).mData = (param_1->soundSample).mData;
  (this->soundSample).mSampleCount = (param_1->soundSample).mSampleCount;
  this->timeElapsed = param_1->timeElapsed;
  this->position = param_1->position;
  this->scale = param_1->scale;
  return this;
}

Assistant:

SpeechBubble() = default;